

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O3

int sptk::snack::xget_window
              (float *dout,int n,int type,int *n0p,float **dinp,int *wsizep,float **windp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  float *din;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar10;
  undefined1 auVar9 [16];
  
  din = *dinp;
  if (*n0p < n) {
    if (din != (float *)0x0) {
      free(din);
    }
    din = (float *)malloc((long)n << 2);
    auVar3 = _DAT_0012ad20;
    auVar2 = _DAT_0012aa40;
    auVar1 = _DAT_0012aa30;
    if (din == (float *)0x0) {
      xget_window();
      return 0;
    }
    if (0 < n) {
      lVar5 = (ulong)(uint)n - 1;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar7 = auVar7 ^ _DAT_0012aa40;
      do {
        auVar8._8_4_ = (int)uVar6;
        auVar8._0_8_ = uVar6;
        auVar8._12_4_ = (int)(uVar6 >> 0x20);
        auVar9 = (auVar8 | auVar1) ^ auVar2;
        iVar4 = auVar7._4_4_;
        if ((bool)(~(auVar9._4_4_ == iVar4 && auVar7._0_4_ < auVar9._0_4_ || iVar4 < auVar9._4_4_) &
                  1)) {
          din[uVar6] = 1.0;
        }
        if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
            auVar9._12_4_ <= auVar7._12_4_) {
          din[uVar6 + 1] = 1.0;
        }
        auVar8 = (auVar8 | auVar3) ^ auVar2;
        iVar10 = auVar8._4_4_;
        if (iVar10 <= iVar4 && (iVar10 != iVar4 || auVar8._0_4_ <= auVar7._0_4_)) {
          din[uVar6 + 2] = 1.0;
          din[uVar6 + 3] = 1.0;
        }
        uVar6 = uVar6 + 4;
      } while ((n + 3U & 0xfffffffc) != uVar6);
    }
    *dinp = din;
    *n0p = n;
  }
  iVar4 = window(din,dout,n,0.0,type,wsizep,windp);
  return iVar4;
}

Assistant:

int xget_window(float *dout, int n, int type, int *n0p, float **dinp,
                int *wsizep, float **windp)
#endif
{
#if 0
  static float *din = NULL;
  static int n0 = 0;
#else
  float *din = *dinp;
  int n0 = *n0p;
#endif
  float preemp = 0.0;

  if(n > n0) {
    register float *p;
    register int i;
    
    if(din) ckfree((void *)din);
    din = NULL;
    if(!(din = (float*)ckalloc(sizeof(float)*n))) {
      Fprintf(stderr,"Allocation problems in xget_window()\n");
      return(FALSE);
    }
    for(i=0, p=din; i++ < n; ) *p++ = 1;
    n0 = n;
#if 1
    *dinp = din;
    *n0p = n0;
#endif
  }
#if 0
  return(window(din, dout, n, preemp, type));
#else
  return(window(din, dout, n, preemp, type, wsizep, windp));
#endif
}